

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap3.c
# Opt level: O3

void ftgtbh_(int *A1,int *A2,int *A3,int *A4,char *A5,int *A6,char *A7,char *A8,char *A9,int *A10,
            size_t C5,size_t C7,size_t C8,size_t C9)

{
  uint maxfield;
  char **ttype;
  char *pcVar1;
  char **tform;
  char **tunit;
  char *s;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  uint uVar5;
  unsigned_long uVar6;
  int nelem;
  ulong uVar7;
  uint celem_len;
  int nelem_00;
  long tfields;
  long B6;
  long B3;
  long B2;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  fitsfile *local_58;
  int *local_50;
  int *local_48;
  int *local_40;
  char *local_38;
  
  local_58 = gFitsFiles[*A1];
  uVar7 = 0;
  local_50 = A4;
  ffgkyj(local_58,"TFIELDS",&tfields,(char *)0x0,A10);
  maxfield = (uint)tfields;
  B2 = (long)*A2;
  local_78 = 1;
  if (1 < (int)(uint)tfields) {
    local_78 = (ulong)(uint)tfields;
  }
  uVar6 = C5;
  if (C5 < gMinStrLen) {
    uVar6 = gMinStrLen;
  }
  B3 = (long)*A3;
  uVar5 = (int)uVar6 + 1;
  local_48 = A2;
  local_40 = A3;
  ttype = (char **)malloc(local_78 * 8);
  pcVar1 = (char *)malloc((ulong)(uVar5 * (int)local_78));
  *ttype = pcVar1;
  local_38 = A5;
  pcVar1 = f2cstrv2(A5,pcVar1,(int)C5,uVar5,(int)local_78);
  do {
    ttype[uVar7] = pcVar1;
    uVar7 = uVar7 + 1;
    pcVar1 = pcVar1 + (int)uVar5;
  } while (local_78 != uVar7);
  uVar7 = 1;
  if (1 < (int)(uint)tfields) {
    uVar7 = (ulong)(uint)tfields;
  }
  uVar6 = C7;
  if (C7 < gMinStrLen) {
    uVar6 = gMinStrLen;
  }
  B6 = (long)*A6;
  celem_len = (int)uVar6 + 1;
  local_60 = (ulong)uVar5;
  tform = (char **)malloc(uVar7 * 8);
  nelem = (int)uVar7;
  pcVar1 = (char *)malloc((ulong)(celem_len * nelem));
  *tform = pcVar1;
  pcVar1 = f2cstrv2(A7,pcVar1,(int)C7,celem_len,nelem);
  uVar3 = 0;
  do {
    tform[uVar3] = pcVar1;
    uVar3 = uVar3 + 1;
    pcVar1 = pcVar1 + (int)celem_len;
  } while (uVar7 != uVar3);
  uVar7 = 1;
  if (1 < (int)(uint)tfields) {
    uVar7 = (ulong)(uint)tfields;
  }
  uVar6 = C8;
  if (C8 < gMinStrLen) {
    uVar6 = gMinStrLen;
  }
  uVar5 = (int)uVar6 + 1;
  local_68 = (ulong)celem_len;
  tunit = (char **)malloc(uVar7 * 8);
  nelem_00 = (int)uVar7;
  pcVar1 = (char *)malloc((ulong)(uVar5 * nelem_00));
  *tunit = pcVar1;
  pcVar1 = f2cstrv2(A8,pcVar1,(int)C8,uVar5,nelem_00);
  uVar3 = 0;
  do {
    tunit[uVar3] = pcVar1;
    uVar3 = uVar3 + 1;
    pcVar1 = pcVar1 + (int)uVar5;
  } while (uVar7 != uVar3);
  sVar4 = gMinStrLen;
  if (gMinStrLen <= C9) {
    sVar4 = C9;
  }
  local_70 = (ulong)uVar5;
  s = (char *)malloc(sVar4 + 1);
  s[C9] = '\0';
  pcVar1 = A9;
  memcpy(s,A9,C9);
  kill_trailing(s,(char)pcVar1);
  ffghtb(local_58,maxfield,&B2,&B3,local_50,ttype,&B6,tform,tunit,s,A10);
  *local_48 = (int)B2;
  *local_40 = (int)B3;
  c2fstrv2(*ttype,local_38,(int)local_60,(int)C5,(int)local_78);
  free(*ttype);
  free(ttype);
  *A6 = (int)B6;
  c2fstrv2(*tform,A7,(int)local_68,(int)C7,nelem);
  free(*tform);
  free(tform);
  c2fstrv2(*tunit,A8,(int)local_70,(int)C8,nelem_00);
  free(*tunit);
  free(tunit);
  sVar2 = strlen(s);
  sVar4 = C9;
  if (sVar2 < C9) {
    sVar4 = sVar2;
  }
  memcpy(A9,s,sVar4);
  if (sVar2 <= C9 && C9 - sVar2 != 0) {
    memset(A9 + sVar2,0x20,C9 - sVar2);
  }
  free(s);
  return;
}

Assistant:

CFextern VOID_cfF(FTGTBH,ftgtbh)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),FITSUNIT,PLONG,PLONG,PINT,PSTRINGV,PLONG,PSTRINGV,PSTRINGV,PSTRING,PINT,CF_0,CF_0,CF_0,CF_0))
{
   QCF(FITSUNIT,1)
   QCF(PLONG,2)
   QCF(PLONG,3)
   QCF(PINT,4)
   QCF(PSTRINGV,5)
   QCF(PLONG,6)
   QCF(PSTRINGV,7)
   QCF(PSTRINGV,8)
   QCF(PSTRING,9)
   QCF(PINT,10)

   fitsfile *fptr;
   long tfields;
   int *status;

   fptr = TCF(ftgtbh,FITSUNIT,1,0);
   status =  TCF(ftgtbh,PINT,10,0);
   ffgkyj( fptr, "TFIELDS", &tfields, 0, status );

   ffghtb(   fptr, (int)tfields
             TCF(ftgtbh,PLONG,2,1)
             TCF(ftgtbh,PLONG,3,1)
             TCF(ftgtbh,PINT,4,1)
             TCF(ftgtbh,PSTRINGV,5,1)
             TCF(ftgtbh,PLONG,6,1)
             TCF(ftgtbh,PSTRINGV,7,1)
             TCF(ftgtbh,PSTRINGV,8,1)
             TCF(ftgtbh,PSTRING,9,1)
             , status );

   RCF(FITSUNIT,1)
   RCF(PLONG,2)
   RCF(PLONG,3)
   RCF(PINT,4)
   RCF(PSTRINGV,5)
   RCF(PLONG,6)
   RCF(PSTRINGV,7)
   RCF(PSTRINGV,8)
   RCF(PSTRING,9)
   RCF(PINT,10)
}